

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

void dash_traverse_func(void *closure,plutovg_path_command_t command,plutovg_point_t *points,
                       int npoints)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  byte bVar4;
  undefined4 in_register_0000000c;
  plutovg_point_t pVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  plutovg_point_t p1;
  undefined8 local_48;
  plutovg_point_t local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if (command == PLUTOVG_PATH_COMMAND_MOVE_TO) {
    cVar2 = *(char *)((long)closure + 0x1c);
    if (cVar2 == '\x01') {
      (**(code **)((long)closure + 0x28))
                (*(undefined8 *)((long)closure + 0x30),0,points,
                 CONCAT44(in_register_0000000c,npoints));
      cVar2 = *(char *)((long)closure + 0x1c);
    }
    *(plutovg_point_t *)((long)closure + 0x20) = *points;
    *(undefined4 *)((long)closure + 0x10) = *(undefined4 *)((long)closure + 0xc);
    *(undefined4 *)((long)closure + 0x18) = *(undefined4 *)((long)closure + 0x14);
    *(char *)((long)closure + 0x1d) = cVar2;
  }
  else {
    if ((command & ~PLUTOVG_PATH_COMMAND_CUBIC_TO) != PLUTOVG_PATH_COMMAND_LINE_TO) {
      __assert_fail("command == PLUTOVG_PATH_COMMAND_LINE_TO || command == PLUTOVG_PATH_COMMAND_CLOSE"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-path.c"
                    ,0x22b,
                    "void dash_traverse_func(void *, plutovg_path_command_t, const plutovg_point_t *, int)"
                   );
    }
    pVar5 = *points;
    uVar1 = *(undefined8 *)((long)closure + 0x20);
    fVar11 = (float)((ulong)uVar1 >> 0x20);
    fVar9 = pVar5.x - (float)uVar1;
    fVar10 = pVar5.y - fVar11;
    fVar8 = SQRT(fVar9 * fVar9 + fVar10 * fVar10);
    fVar7 = *(float *)((long)closure + 0x10);
    fVar6 = *(float *)(*closure +
                      (long)(*(int *)((long)closure + 0x18) % *(int *)((long)closure + 8)) * 4) -
            fVar7;
    local_40 = pVar5;
    if (fVar8 <= fVar6) {
      bVar4 = *(byte *)((long)closure + 0x1d);
    }
    else {
      bVar4 = *(byte *)((long)closure + 0x1d);
      fVar12 = 0.0;
      uStack_20 = 0;
      uStack_1c = 0;
      uStack_30 = 0;
      local_38._0_4_ = (float)uVar1;
      local_28 = fVar9;
      fStack_24 = fVar10;
      do {
        local_38 = uVar1;
        fVar12 = fVar12 + fVar6;
        fVar7 = (fVar12 / fVar8) * local_28 + (float)local_38;
        local_48 = CONCAT44((fVar12 / fVar8) * fStack_24 + fVar11,fVar7);
        (**(code **)((long)closure + 0x28))
                  (*(undefined8 *)((long)closure + 0x30),bVar4 & 1,&local_48,1);
        *(undefined4 *)((long)closure + 0x10) = 0;
        bVar4 = *(byte *)((long)closure + 0x1d) ^ 1;
        *(byte *)((long)closure + 0x1d) = bVar4;
        iVar3 = *(int *)((long)closure + 0x18) + 1;
        *(int *)((long)closure + 0x18) = iVar3;
        fVar6 = *(float *)(*closure + (long)(iVar3 % *(int *)((long)closure + 8)) * 4);
        fVar11 = local_38._4_4_;
        uVar1 = local_38;
      } while (fVar6 < fVar8 - fVar12);
      fVar7 = 0.0;
      fVar8 = fVar8 - fVar12;
    }
    if ((bVar4 & 1) != 0) {
      (**(code **)((long)closure + 0x28))(*(undefined8 *)((long)closure + 0x30),1,&local_40,1);
      fVar7 = *(float *)((long)closure + 0x10);
      pVar5 = local_40;
    }
    *(float *)((long)closure + 0x10) = fVar8 + fVar7;
    *(plutovg_point_t *)((long)closure + 0x20) = pVar5;
  }
  return;
}

Assistant:

static void dash_traverse_func(void* closure, plutovg_path_command_t command, const plutovg_point_t* points, int npoints)
{
    dasher_t* dasher = (dasher_t*)(closure);
    if(command == PLUTOVG_PATH_COMMAND_MOVE_TO) {
        if(dasher->start_toggle)
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, npoints);
        dasher->current_point = points[0];
        dasher->phase = dasher->start_phase;
        dasher->index = dasher->start_index;
        dasher->toggle = dasher->start_toggle;
        return;
    }

    assert(command == PLUTOVG_PATH_COMMAND_LINE_TO || command == PLUTOVG_PATH_COMMAND_CLOSE);
    plutovg_point_t p0 = dasher->current_point;
    plutovg_point_t p1 = points[0];
    float dx = p1.x - p0.x;
    float dy = p1.y - p0.y;
    float dist0 = sqrtf(dx*dx + dy*dy);
    float dist1 = 0.f;
    while(dist0 - dist1 > dasher->dashes[dasher->index % dasher->ndashes] - dasher->phase) {
        dist1 += dasher->dashes[dasher->index % dasher->ndashes] - dasher->phase;
        float a = dist1 / dist0;
        plutovg_point_t p = { p0.x + a * dx, p0.y + a * dy };
        if(dasher->toggle) {
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p, 1);
        } else {
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_MOVE_TO, &p, 1);
        }

        dasher->phase = 0.f;
        dasher->toggle = !dasher->toggle;
        dasher->index++;
    }

    if(dasher->toggle) {
        dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p1, 1);
    }

    dasher->phase += dist0 - dist1;
    dasher->current_point = p1;
}